

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

ON_OBSOLETE_V5_DimRadial *
ON_OBSOLETE_V5_DimRadial::CreateFromV2RadialDimension
          (ON_OBSOLETE_V2_DimRadial *V2_radial_dimension,ON_3dmAnnotationContext *annotation_context
          ,ON_OBSOLETE_V5_DimRadial *destination)

{
  if (destination == (ON_OBSOLETE_V5_DimRadial *)0x0) {
    destination = (ON_OBSOLETE_V5_DimRadial *)operator_new(0xe0);
    ON_OBSOLETE_V5_DimRadial(destination);
  }
  ON_OBSOLETE_V5_Annotation::Internal_InitializeFromV2Annotation
            (&destination->super_ON_OBSOLETE_V5_Annotation,
             &V2_radial_dimension->super_ON_OBSOLETE_V2_Annotation,annotation_context);
  return (ON_OBSOLETE_V5_DimRadial *)&destination->super_ON_OBSOLETE_V5_Annotation;
}

Assistant:

ON_OBSOLETE_V5_DimRadial* ON_OBSOLETE_V5_DimRadial::CreateFromV2RadialDimension(
  const class ON_OBSOLETE_V2_DimRadial& V2_radial_dimension,
  const class ON_3dmAnnotationContext* annotation_context,
  ON_OBSOLETE_V5_DimRadial* destination
)
{
  ON_OBSOLETE_V5_DimRadial* V5_radial_dimension
    = (nullptr != destination)
    ? destination
    : new ON_OBSOLETE_V5_DimRadial();

  V5_radial_dimension->Internal_InitializeFromV2Annotation(V2_radial_dimension,annotation_context);

  return V5_radial_dimension;
}